

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void xy_y_convolve_6tap_16x2_avx2(void)

{
  undefined8 *puVar1;
  undefined1 auVar2 [32];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  __m256i *in_stack_fffffffffffffe80;
  __m256i *in_stack_fffffffffffffe88;
  
  puVar1 = (undefined8 *)(in_RDI + in_RSI * 10);
  uVar3 = puVar1[1];
  uVar4 = puVar1[2];
  uVar5 = puVar1[3];
  *(undefined8 *)(in_RDX + 0xa0) = *puVar1;
  *(undefined8 *)(in_RDX + 0xa8) = uVar3;
  *(undefined8 *)(in_RDX + 0xb0) = uVar4;
  *(undefined8 *)(in_RDX + 0xb8) = uVar5;
  auVar2 = vpunpcklwd_avx2(*(undefined1 (*) [32])(in_RDX + 0x80),
                           *(undefined1 (*) [32])(in_RDX + 0xa0));
  *(undefined1 (*) [32])(in_RCX + 8) = auVar2;
  auVar2 = vpunpckhwd_avx2(*(undefined1 (*) [32])(in_RDX + 0x80),
                           *(undefined1 (*) [32])(in_RDX + 0xa0));
  *(undefined1 (*) [32])(in_RCX + 0x14) = auVar2;
  puVar1 = (undefined8 *)(in_RDI + in_RSI * 0xc);
  uVar3 = puVar1[1];
  uVar4 = puVar1[2];
  uVar5 = puVar1[3];
  *(undefined8 *)(in_RDX + 0x80) = *puVar1;
  *(undefined8 *)(in_RDX + 0x88) = uVar3;
  *(undefined8 *)(in_RDX + 0x90) = uVar4;
  *(undefined8 *)(in_RDX + 0x98) = uVar5;
  auVar2 = vpunpcklwd_avx2(*(undefined1 (*) [32])(in_RDX + 0xa0),
                           *(undefined1 (*) [32])(in_RDX + 0x80));
  *(undefined1 (*) [32])(in_R8 + 8) = auVar2;
  auVar2 = vpunpckhwd_avx2(*(undefined1 (*) [32])(in_RDX + 0xa0),
                           *(undefined1 (*) [32])(in_RDX + 0x80));
  *(undefined1 (*) [32])(in_R8 + 0x14) = auVar2;
  xy_y_convolve_6tap_16_avx2
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,(__m256i *)0x9a8453);
  xy_y_convolve_6tap_16_avx2
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,(__m256i *)0x9a846a);
  *in_RCX = in_RCX[4];
  in_RCX[1] = in_RCX[5];
  in_RCX[2] = in_RCX[6];
  in_RCX[3] = in_RCX[7];
  in_RCX[4] = in_RCX[8];
  in_RCX[5] = in_RCX[9];
  in_RCX[6] = in_RCX[10];
  in_RCX[7] = in_RCX[0xb];
  in_RCX[0xc] = in_RCX[0x10];
  in_RCX[0xd] = in_RCX[0x11];
  in_RCX[0xe] = in_RCX[0x12];
  in_RCX[0xf] = in_RCX[0x13];
  in_RCX[0x10] = in_RCX[0x14];
  in_RCX[0x11] = in_RCX[0x15];
  in_RCX[0x12] = in_RCX[0x16];
  in_RCX[0x13] = in_RCX[0x17];
  *in_R8 = in_R8[4];
  in_R8[1] = in_R8[5];
  in_R8[2] = in_R8[6];
  in_R8[3] = in_R8[7];
  in_R8[4] = in_R8[8];
  in_R8[5] = in_R8[9];
  in_R8[6] = in_R8[10];
  in_R8[7] = in_R8[0xb];
  in_R8[0xc] = in_R8[0x10];
  in_R8[0xd] = in_R8[0x11];
  in_R8[0xe] = in_R8[0x12];
  in_R8[0xf] = in_R8[0x13];
  in_R8[0x10] = in_R8[0x14];
  in_R8[0x11] = in_R8[0x15];
  in_R8[0x12] = in_R8[0x16];
  in_R8[0x13] = in_R8[0x17];
  return;
}

Assistant:

static inline void xy_y_convolve_6tap_16x2_avx2(
    const int16_t *const src, const ptrdiff_t stride, __m256i s_256[6],
    __m256i ss_256[6], __m256i tt_256[6], const __m256i coeffs[3],
    __m256i r[4]) {
  s_256[5] = _mm256_loadu_si256((__m256i *)(src + 5 * stride));
  ss_256[2] = _mm256_unpacklo_epi16(s_256[4], s_256[5]);
  ss_256[5] = _mm256_unpackhi_epi16(s_256[4], s_256[5]);
  s_256[4] = _mm256_loadu_si256((__m256i *)(src + 6 * stride));
  tt_256[2] = _mm256_unpacklo_epi16(s_256[5], s_256[4]);
  tt_256[5] = _mm256_unpackhi_epi16(s_256[5], s_256[4]);

  xy_y_convolve_6tap_16_avx2(ss_256, coeffs, r + 0);
  xy_y_convolve_6tap_16_avx2(tt_256, coeffs, r + 2);

  ss_256[0] = ss_256[1];
  ss_256[1] = ss_256[2];
  ss_256[3] = ss_256[4];
  ss_256[4] = ss_256[5];

  tt_256[0] = tt_256[1];
  tt_256[1] = tt_256[2];
  tt_256[3] = tt_256[4];
  tt_256[4] = tt_256[5];
}